

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void StateApplyMove(pyhanabi_state_t *state,pyhanabi_move_t *move)

{
  long *in_RSI;
  long *in_RDI;
  HanabiMove *hanabi_move;
  HanabiState *hanabi_state;
  HanabiState *in_stack_00000188;
  HanabiMove in_stack_00000190;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x152,"void StateApplyMove(pyhanabi_state_t *, pyhanabi_move_t *)");
  }
  if (*in_RDI == 0) {
    __assert_fail("state->state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x153,"void StateApplyMove(pyhanabi_state_t *, pyhanabi_move_t *)");
  }
  if (in_RSI == (long *)0x0) {
    __assert_fail("move != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x154,"void StateApplyMove(pyhanabi_state_t *, pyhanabi_move_t *)");
  }
  if (*in_RSI != 0) {
    hanabi_learning_env::HanabiState::ApplyMove(in_stack_00000188,in_stack_00000190);
    return;
  }
  __assert_fail("move->move != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x155,"void StateApplyMove(pyhanabi_state_t *, pyhanabi_move_t *)");
}

Assistant:

void StateApplyMove(pyhanabi_state_t* state, pyhanabi_move_t* move) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  REQUIRE(move != nullptr);
  REQUIRE(move->move != nullptr);
  auto hanabi_state =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state);
  auto hanabi_move =
      reinterpret_cast<const hanabi_learning_env::HanabiMove*>(move->move);
  hanabi_state->ApplyMove(*hanabi_move);
}